

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

char * wabt::anon_unknown_0::CWriter::GetReferenceTypeName(Type *type)

{
  Enum EVar1;
  Type *type_local;
  
  EVar1 = Type::operator_cast_to_Enum(type);
  if (EVar1 == ExnRef) {
    type_local = (Type *)anon_var_dwarf_c8291;
  }
  else if (EVar1 == ExternRef) {
    type_local = (Type *)anon_var_dwarf_c82c8;
  }
  else {
    if (EVar1 != FuncRef) {
      abort();
    }
    type_local = (Type *)anon_var_dwarf_c829c;
  }
  return (char *)type_local;
}

Assistant:

const char* CWriter::GetReferenceTypeName(const Type& type) {
  switch (type) {
    case Type::FuncRef:
      return "funcref";
    case Type::ExternRef:
      return "externref";
    case Type::ExnRef:
      return "exnref";
    default:
      WABT_UNREACHABLE;
  }
}